

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O3

void __thiscall diligent_spirv_cross::CFG::build_post_order_visit_order(CFG *this)

{
  uint32_t block_id;
  
  block_id = (this->func->entry_block).id;
  this->visit_count = 0;
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->visit_order)._M_h);
  (this->post_order).super_VectorView<unsigned_int>.buffer_size = 0;
  post_order_visit(this,block_id);
  return;
}

Assistant:

void CFG::build_post_order_visit_order()
{
	uint32_t block = func.entry_block;
	visit_count = 0;
	visit_order.clear();
	post_order.clear();
	post_order_visit(block);
}